

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmq.hpp
# Opt level: O2

__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
__thiscall
rmq<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_unsigned_long>
::query(rmq<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_unsigned_long>
        *this,__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              range_begin,
       __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
       range_end)

{
  uint *puVar1;
  uint *puVar2;
  pointer pvVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var22;
  ulong uVar23;
  
  puVar2 = (this->_begin)._M_current;
  uVar20 = (long)range_begin._M_current - (long)puVar2 >> 2;
  uVar23 = (long)range_end._M_current - (long)puVar2 >> 2;
  if (uVar23 <= uVar20) {
    __assert_fail("begin_idx < end_idx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xb5,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<unsigned int *, std::vector<unsigned int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<unsigned int *, std::vector<unsigned int>>, index_t = unsigned long]"
                 );
  }
  if (this->n < uVar23) {
    __assert_fail("end_idx <= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xb6,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<unsigned int *, std::vector<unsigned int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<unsigned int *, std::vector<unsigned int>>, index_t = unsigned long]"
                 );
  }
  uVar17 = uVar20 - 1;
  uVar19 = this->superblock_size;
  uVar14 = uVar17 / uVar19 + 1;
  if (puVar2 == range_begin._M_current) {
    uVar14 = 0;
  }
  uVar7 = uVar23 / uVar19;
  uVar8 = uVar7 - uVar14;
  _Var22._M_current = range_begin._M_current;
  if (uVar7 < uVar14 || uVar8 == 0) {
LAB_00124428:
    uVar8 = uVar14 - 1;
    if ((uVar8 < uVar7) && (uVar20 != uVar14 * uVar19)) {
      uVar13 = this->n_blocks_per_superblock;
      lVar15 = uVar17 / this->block_size + 1;
      uVar18 = this->block_size * lVar15;
      uVar16 = lVar15 - uVar13 * uVar8;
      if (uVar13 != uVar16) {
        uVar9 = ~uVar16 + uVar13;
        if (uVar9 == 0) {
          uVar12 = 0x40;
        }
        else {
          lVar15 = 0x3f;
          if (uVar9 != 0) {
            for (; uVar9 >> lVar15 == 0; lVar15 = lVar15 + -1) {
            }
          }
          uVar12 = (uint)lVar15 ^ 0x3f;
        }
        if (puVar2[(ulong)*(ushort *)
                           (uVar16 * 2 +
                            *(long *)&(this->block_mins).
                                      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[0x40 - uVar12].
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data +
                           (uVar13 - (long)((1 << (-(char)uVar12 & 0x1fU)) / 2)) * uVar8 * 2) +
                   uVar19 * uVar8] < *_Var22._M_current) {
          _Var22._M_current =
               puVar2 + (ulong)*(ushort *)
                                (uVar16 * 2 +
                                 *(long *)&(this->block_mins).
                                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[0x40 - uVar12].
                                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                           ._M_impl.super__Vector_impl_data +
                                (uVar13 - (long)((1 << (-(char)uVar12 & 0x1fU)) / 2)) * uVar8 * 2) +
                        uVar19 * uVar8;
        }
      }
      if ((uVar20 <= uVar18 && uVar18 - uVar20 != 0) &&
         (_Var10 = std::
                   __min_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                             (range_begin._M_current,puVar2 + uVar18),
         *_Var10._M_current < *_Var22._M_current)) {
        _Var22 = _Var10;
      }
    }
    if (((uVar14 <= uVar7) && (uVar7 != this->n_superblocks)) &&
       (uVar19 = this->superblock_size * uVar7, uVar23 != uVar19)) {
      lVar15 = this->n_blocks_per_superblock * uVar7;
      uVar13 = uVar23 / this->block_size;
      uVar16 = uVar13 - lVar15;
      if (uVar16 != 0) {
        uVar18 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        iVar6 = 1 << ((byte)uVar18 & 0x1f);
        lVar11 = (long)(iVar6 / 2) * uVar7;
        puVar4 = (this->_begin)._M_current;
        lVar21 = *(long *)&(this->block_mins).
                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar18 & 0xffffffff].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data;
        puVar1 = puVar4 + *(ushort *)(lVar21 + (lVar15 - lVar11) * 2) + uVar19;
        uVar12 = *puVar1;
        uVar5 = *_Var22._M_current;
        if (uVar12 < *_Var22._M_current) {
          _Var22._M_current = puVar1;
          uVar5 = uVar12;
        }
        puVar4 = puVar4 + *(ushort *)(lVar21 + (uVar13 - (iVar6 + lVar11)) * 2) + uVar19;
        if (*puVar4 < uVar5) {
          _Var22._M_current = puVar4;
        }
      }
      uVar13 = uVar13 * this->block_size;
      if ((uVar13 < uVar23) &&
         (_Var10 = std::
                   __min_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                             ((this->_begin)._M_current + uVar13,range_end._M_current),
         *_Var10._M_current < *_Var22._M_current)) {
        _Var22 = _Var10;
      }
    }
    if (uVar7 < uVar14) {
      uVar19 = this->block_size;
      uVar17 = uVar17 / uVar19 + 1;
      if (puVar2 == range_begin._M_current) {
        uVar17 = 0;
      }
      uVar7 = uVar23 / uVar19;
      uVar13 = uVar7 - uVar17;
      if (uVar17 <= uVar7 && uVar13 != 0) {
        if (uVar17 / this->n_blocks_per_superblock != uVar7 / this->n_blocks_per_superblock) {
          __assert_fail("left_b / n_blocks_per_superblock == right_b / n_blocks_per_superblock",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                        ,0x114,
                        "Iterator rmq<__gnu_cxx::__normal_iterator<unsigned int *, std::vector<unsigned int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<unsigned int *, std::vector<unsigned int>>, index_t = unsigned long]"
                       );
        }
        uVar16 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        iVar6 = 1 << ((byte)uVar16 & 0x1f);
        if (uVar14 < 2) {
          lVar21 = 0;
          lVar15 = 0;
        }
        else {
          lVar15 = (long)(iVar6 / 2) * uVar8;
          lVar21 = uVar8 * this->superblock_size;
        }
        puVar2 = (this->_begin)._M_current;
        lVar11 = *(long *)&(this->block_mins).
                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar16 & 0xffffffff].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data;
        uVar12 = puVar2[(ulong)*(ushort *)(lVar11 + (uVar17 - lVar15) * 2) + lVar21];
        uVar5 = *_Var22._M_current;
        if (uVar12 < *_Var22._M_current) {
          _Var22._M_current = puVar2 + (ulong)*(ushort *)(lVar11 + (uVar17 - lVar15) * 2) + lVar21;
          uVar5 = uVar12;
        }
        if (puVar2[(ulong)*(ushort *)(lVar11 + (uVar7 - (iVar6 + lVar15)) * 2) + lVar21] < uVar5) {
          _Var22._M_current =
               puVar2 + (ulong)*(ushort *)(lVar11 + (uVar7 - (iVar6 + lVar15)) * 2) + lVar21;
        }
        if (uVar20 < uVar17 * uVar19) {
          _Var10 = std::
                   __min_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                             (range_begin._M_current,puVar2 + uVar17 * uVar19);
          if (*_Var10._M_current < *_Var22._M_current) {
            _Var22 = _Var10;
          }
          uVar19 = this->block_size;
        }
        if (uVar23 <= uVar19 * uVar7) {
          return (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )_Var22._M_current;
        }
        range_begin._M_current = (this->_begin)._M_current + uVar19 * uVar7;
      }
      _Var10 = std::
               __min_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (range_begin._M_current,range_end._M_current);
      if (*_Var10._M_current < *_Var22._M_current) {
        _Var22 = _Var10;
      }
    }
    return (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            )_Var22._M_current;
  }
  uVar13 = 0x3f;
  if (uVar8 != 0) {
    for (; uVar8 >> uVar13 == 0; uVar13 = uVar13 - 1) {
    }
  }
  uVar13 = uVar13 & 0xffffffff;
  pvVar3 = (this->superblock_mins).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar13 < (ulong)(((long)(this->superblock_mins).
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18)) {
    lVar15 = *(long *)&pvVar3[uVar13].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data;
    uVar8 = (long)*(pointer *)
                   ((long)&pvVar3[uVar13].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data + 8) - lVar15 >> 3;
    if (uVar14 < uVar8) {
      uVar13 = uVar7 - (long)(1 << ((byte)uVar13 & 0x1f));
      if (uVar8 <= uVar13) {
        __assert_fail("dist < superblock_mins.size() && right_sb - (1<<dist) < superblock_mins[dist].size()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                      ,0xcb,
                      "Iterator rmq<__gnu_cxx::__normal_iterator<unsigned int *, std::vector<unsigned int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<unsigned int *, std::vector<unsigned int>>, index_t = unsigned long]"
                     );
      }
      _Var22._M_current = puVar2 + *(long *)(lVar15 + uVar14 * 8);
      if (puVar2[*(long *)(lVar15 + uVar13 * 8)] < puVar2[*(long *)(lVar15 + uVar14 * 8)]) {
        _Var22._M_current = puVar2 + *(long *)(lVar15 + uVar13 * 8);
      }
      goto LAB_00124428;
    }
  }
  __assert_fail("dist < superblock_mins.size() && left_sb < superblock_mins[dist].size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                ,0xc9,
                "Iterator rmq<__gnu_cxx::__normal_iterator<unsigned int *, std::vector<unsigned int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<unsigned int *, std::vector<unsigned int>>, index_t = unsigned long]"
               );
}

Assistant:

Iterator query(Iterator range_begin, Iterator range_end) {
        // find superblocks fully contained within range
        index_t begin_idx = std::distance(_begin, range_begin);
        index_t end_idx = std::distance(_begin, range_end);
        assert(begin_idx < end_idx);
        assert(end_idx <= n);

        // round up to next superblock
        index_t left_sb  = (begin_idx - 1) / superblock_size + 1;
        if (begin_idx == 0)
            left_sb = 0;
        // round down to prev superblock
        index_t right_sb = end_idx / superblock_size;

        // init result
        Iterator min_pos = range_begin;

        // if there is at least one superblock
        if (left_sb < right_sb) {
            // get largest power of two that doesn't exceed the number of
            // superblocks from (left,right)
            index_t n_sb = right_sb - left_sb;
            unsigned int dist = floorlog2(n_sb);

            assert(dist < superblock_mins.size() && left_sb < superblock_mins[dist].size());
            min_pos = _begin + superblock_mins[dist][left_sb];
            assert(dist < superblock_mins.size() && right_sb - (1<<dist) < superblock_mins[dist].size());
            Iterator right_sb_min = _begin + superblock_mins[dist][right_sb - (1 << dist)];
            if (*min_pos > *right_sb_min) {
                min_pos = right_sb_min;
            }
        }

        // go to left -> blocks -> sub-block
        if (left_sb <= right_sb && left_sb != 0 && begin_idx != left_sb*superblock_size) {
            index_t left_b = (begin_idx - 1) / block_size + 1;
            index_t left_b_gidx = left_b * block_size;
            left_b -= (left_sb - 1)*n_blocks_per_superblock;
            index_t n_b = n_blocks_per_superblock - left_b;
            if (n_b > 0) {
                unsigned int level = ceillog2(n_b);
                index_t sb_offset = (left_sb-1)*(n_blocks_per_superblock - (1<<level)/2);
                Iterator block_min_it = _begin + block_mins[level][left_b + sb_offset] + (left_sb-1)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
            }

            // go left into remaining block, if elements left
            if (left_b_gidx > begin_idx) {
                // linearly search (at most block_size elements)
                Iterator inblock_min_it = std::min_element(range_begin, _begin + left_b_gidx);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }
        }

        // go to right -> blocks -> sub-block
        if (left_sb <= right_sb && right_sb != n_superblocks && end_idx != right_sb*superblock_size) {
            index_t left_b = right_sb*n_blocks_per_superblock;
            index_t right_b = end_idx / block_size;
            index_t n_b = right_b - left_b;
            if (n_b > 0) {
                unsigned int dist = floorlog2(n_b);
                index_t sb_offset = right_sb*((1<<dist)/2);
                Iterator block_min_it = _begin + block_mins[dist][left_b - sb_offset] + (right_sb)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
                block_min_it = _begin + block_mins[dist][right_b - sb_offset - (1<<dist)] + (right_sb)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
            }

            // go right into remaining block, if elements left
            index_t left_gl_idx = right_b*block_size;
            if (left_gl_idx < end_idx) {
                // linearly search (at most block_size elements)
                Iterator inblock_min_it = std::min_element(_begin + left_gl_idx, range_end);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }
        }

        // if there are no superblocks covered (both indeces in same superblock)
        if (left_sb > right_sb) {
            index_t left_b = (begin_idx - 1) / block_size + 1;
            if (begin_idx == 0)
                left_b = 0;
            index_t right_b = end_idx / block_size;


            if (left_b < right_b) {
                // if blocks are in between: get mins of blocks in range
                // NOTE: there was a while if-else block here to handle the
                //       case if blocks would span accross the boundary of two
                //       superblocks, this should however never happen
                //       git blame this line to find where this code was removed
                // assert blocks lie in the same superblock
                assert(left_b / n_blocks_per_superblock == right_b / n_blocks_per_superblock);

                unsigned int dist = floorlog2(right_b - left_b);
                index_t sb_offset = 0;
                index_t sb_size_offset = 0;
                if (left_sb > 1) {
                    sb_offset = (left_sb-1)*((1<<dist)/2);
                    sb_size_offset = (left_sb-1)*superblock_size;
                }
                Iterator block_min_it = _begin + block_mins[dist][left_b - sb_offset] + sb_size_offset;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
                block_min_it = _begin + block_mins[dist][right_b - sb_offset - (1<<dist)] + sb_size_offset;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;

                // remaining inblock
                if (begin_idx < left_b*block_size) {
                    Iterator inblock_min_it = std::min_element(range_begin, _begin + left_b*block_size);
                    if (*inblock_min_it < *min_pos) {
                        min_pos = inblock_min_it;
                    }
                }
                if (end_idx > right_b*block_size) {
                    Iterator inblock_min_it = std::min_element(_begin + right_b*block_size, range_end);
                    if (*inblock_min_it < *min_pos) {
                        min_pos = inblock_min_it;
                    }
                }
            } else {
                // no blocks at all
                Iterator inblock_min_it = std::min_element(range_begin, range_end);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }

        }

        // return the minimum found
        return min_pos;
    }